

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O0

void __thiscall miniros::master::Master::setupBindings(Master *this)

{
  element_type *function_name;
  element_type *__s;
  allocator<char> *in_stack_fffffffffffffac0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  offset_in_Master_to_subr in_stack_fffffffffffffae0;
  allocator<char> *method;
  Master *in_stack_fffffffffffffaf0;
  Master *object;
  string *in_stack_fffffffffffffaf8;
  RPCManager *in_stack_fffffffffffffb00;
  RPCManager *this_01;
  allocator<char> local_429;
  string local_428 [32];
  code *local_408;
  undefined8 local_400;
  allocator<char> local_3f1;
  string local_3f0 [32];
  code *local_3d0;
  undefined8 local_3c8;
  allocator<char> local_3b9;
  string local_3b8 [32];
  code *local_398;
  undefined8 local_390;
  allocator<char> local_381;
  string local_380 [32];
  code *local_360;
  undefined8 local_358;
  undefined1 local_349 [33];
  code *local_328;
  undefined8 local_320;
  allocator<char> local_311;
  string local_310 [32];
  code *local_2f0;
  undefined8 local_2e8;
  undefined1 local_2d9 [33];
  code *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a1 [33];
  code *local_280;
  undefined8 local_278;
  allocator<char> local_269;
  string local_268 [32];
  code *local_248;
  undefined8 local_240;
  allocator<char> local_231;
  string local_230 [32];
  code *local_210;
  undefined8 local_208;
  allocator<char> local_1f9;
  string local_1f8 [32];
  code *local_1d8;
  undefined8 local_1d0;
  allocator<char> local_1c1;
  string local_1c0 [32];
  code *local_1a0;
  undefined8 local_198;
  allocator<char> local_189;
  string local_188 [32];
  code *local_168;
  undefined8 local_160;
  allocator<char> local_151;
  string local_150 [32];
  code *local_130;
  undefined8 local_128;
  allocator<char> local_119;
  string local_118 [32];
  code *local_f8;
  undefined8 local_f0;
  allocator<char> local_e1;
  string local_e0 [32];
  code *local_c0;
  undefined8 local_b8;
  allocator<char> local_a9;
  string local_a8 [32];
  code *local_88;
  undefined8 local_80;
  allocator<char> local_71;
  string local_70 [32];
  code *local_50;
  undefined8 local_48;
  allocator<char> local_29;
  string local_28 [40];
  
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x526d08);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_50 = registerPublisher;
  local_48 = 0;
  RPCManager::
  bindEx4<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string(local_28);
  ::std::allocator<char>::~allocator(&local_29);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x526db8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_88 = unregisterPublisher;
  local_80 = 0;
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string(local_70);
  ::std::allocator<char>::~allocator(&local_71);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x526e68);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_c0 = registerSubscriber;
  local_b8 = 0;
  RPCManager::
  bindEx4<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string(local_a8);
  ::std::allocator<char>::~allocator(&local_a9);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x526f18);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_f8 = unregisterSubscriber;
  local_f0 = 0;
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string(local_e0);
  ::std::allocator<char>::~allocator(&local_e1);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x526fc8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_130 = getPublishedTopics;
  local_128 = 0;
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string(local_118);
  ::std::allocator<char>::~allocator(&local_119);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x527078);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_168 = getTopicTypes;
  local_160 = 0;
  RPCManager::bindEx1<miniros::master::Master,std::__cxx11::string>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string(local_150);
  ::std::allocator<char>::~allocator(&local_151);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x527128);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_1a0 = getSystemState;
  local_198 = 0;
  RPCManager::bindEx1<miniros::master::Master,std::__cxx11::string>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string(local_188);
  ::std::allocator<char>::~allocator(&local_189);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5271d8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_1d8 = lookupService;
  local_1d0 = 0;
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string(local_1c0);
  ::std::allocator<char>::~allocator(&local_1c1);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x527288);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_210 = unregisterService;
  local_208 = 0;
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string(local_1f8);
  ::std::allocator<char>::~allocator(&local_1f9);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x527338);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_248 = registerService;
  local_240._0_1_ = false;
  local_240._1_6_ = 0;
  local_240._7_1_ = 0;
  RPCManager::
  bindEx4<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string(local_230);
  ::std::allocator<char>::~allocator(&local_231);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5273e8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_280 = lookupNode;
  local_278 = 0;
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string(local_268);
  ::std::allocator<char>::~allocator(&local_269);
  function_name =
       ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)0x527498);
  this_01 = (RPCManager *)local_2a1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_2b8 = hasParam;
  local_2b0 = 0;
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (this_01,&function_name->uri_,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string((string *)(local_2a1 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_2a1);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x52753c);
  object = (Master *)local_2d9;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_2f0 = setParam;
  local_2e8 = 0;
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,XmlRpc::XmlRpcValue>
            (this_01,&function_name->uri_,object,in_stack_fffffffffffffae0);
  ::std::__cxx11::string::~string((string *)(local_2d9 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_2d9);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5275e0);
  method = &local_311;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_328 = getParam;
  local_320 = 0;
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (this_01,&function_name->uri_,object,(offset_in_Master_to_subr)method);
  ::std::__cxx11::string::~string(local_310);
  ::std::allocator<char>::~allocator(&local_311);
  __s = ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x527684);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_349;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)__s,in_stack_fffffffffffffac0);
  local_360 = deleteParam;
  local_358 = 0;
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (this_01,&function_name->uri_,object,(offset_in_Master_to_subr)method);
  ::std::__cxx11::string::~string((string *)(local_349 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_349);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x527728);
  __a = &local_381;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  local_398 = searchParam;
  local_390 = 0;
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (this_01,&function_name->uri_,object,(offset_in_Master_to_subr)method);
  ::std::__cxx11::string::~string(local_380);
  ::std::allocator<char>::~allocator(&local_381);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5277cc);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  local_3d0 = subscribeParam;
  local_3c8 = 0;
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this_01,&function_name->uri_,object,(offset_in_Master_to_subr)method);
  ::std::__cxx11::string::~string(local_3b8);
  ::std::allocator<char>::~allocator(&local_3b9);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x527870);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  local_408 = unsubscribeParam;
  local_400 = 0;
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this_01,&function_name->uri_,object,(offset_in_Master_to_subr)method);
  ::std::__cxx11::string::~string(local_3f0);
  ::std::allocator<char>::~allocator(&local_3f1);
  ::std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x527914);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  RPCManager::bindEx1<miniros::master::Master,std::__cxx11::string>
            (this_01,&function_name->uri_,object,(offset_in_Master_to_subr)method);
  ::std::__cxx11::string::~string(local_428);
  ::std::allocator<char>::~allocator(&local_429);
  return;
}

Assistant:

void Master::setupBindings()
{
  // Core master part.
  m_rpcManager->bindEx4("registerPublisher", this, &Master::registerPublisher);
  m_rpcManager->bindEx3("unregisterPublisher", this, &Master::unregisterPublisher);
  m_rpcManager->bindEx4("registerSubscriber", this, &Master::registerSubscriber);
  m_rpcManager->bindEx3("unregisterSubscriber", this, &Master::unregisterSubscriber);
  m_rpcManager->bindEx2("getPublishedTopics", this, &Master::getPublishedTopics);
  m_rpcManager->bindEx1("getTopicTypes", this, &Master::getTopicTypes);
  m_rpcManager->bindEx1("getSystemState", this, &Master::getSystemState);

  m_rpcManager->bindEx2("lookupService", this, &Master::lookupService);
  m_rpcManager->bindEx3("unregisterService", this, &Master::unregisterService);
  m_rpcManager->bindEx4("registerService", this, &Master::registerService);
  m_rpcManager->bindEx2("lookupNode", this, &Master::lookupNode);

  // Rosparam part.
  m_rpcManager->bindEx2("hasParam", this, &Master::hasParam);
  m_rpcManager->bindEx3("setParam", this, &Master::setParam);
  m_rpcManager->bindEx2("getParam", this, &Master::getParam);
  m_rpcManager->bindEx2("deleteParam", this, &Master::deleteParam);
  m_rpcManager->bindEx2("searchParam", this, &Master::searchParam);
  m_rpcManager->bindEx3("subscribeParam", this, &Master::subscribeParam);
  m_rpcManager->bindEx3("unsubscribeParam", this, &Master::unsubscribeParam);
  m_rpcManager->bindEx1("getParamNames", this, &Master::getParamNames);
}